

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::TestVectorTypesInit(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::TestVectorTypesData_*,_false> _Var2;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  _Var3;
  FunctionData *pFVar4;
  pointer pTVar5;
  pointer pDVar6;
  pointer *__ptr;
  pointer pTVar7;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *entry_1;
  pointer puVar8;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *entry;
  vector<duckdb::TestType,_true> test_types;
  map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
  test_type_map;
  TestVectorInfo info;
  _Head_base<0UL,_duckdb::TestVectorTypesData_*,_false> local_148;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  local_140;
  vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> local_138;
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
  local_120;
  undefined1 local_f0 [8];
  TestType local_e8;
  
  local_140._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
        )(tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )this;
  pFVar4 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  make_uniq<duckdb::TestVectorTypesData>();
  TestAllTypesFun::GetTestTypes((vector<duckdb::TestType,_true> *)&local_138,false);
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pTVar7 = local_138.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar7 != local_138.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>.
                _M_impl.super__Vector_impl_data._M_finish; pTVar7 = pTVar7 + 1) {
    local_f0[0] = (pTVar7->type).id_;
    TestType::TestType(&local_e8,pTVar7);
    ::std::
    _Rb_tree<duckdb::LogicalTypeId,std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>,std::_Select1st<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>>
    ::_M_emplace_unique<std::pair<duckdb::LogicalTypeId,duckdb::TestType>>
              ((_Rb_tree<duckdb::LogicalTypeId,std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>,std::_Select1st<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>>
                *)&local_120,(pair<duckdb::LogicalTypeId,_duckdb::TestType> *)local_f0);
    TestType::~TestType(&local_e8);
  }
  pTVar5 = unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
           ::operator->((unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
                         *)&local_148);
  local_f0 = (undefined1  [8])(pFVar4 + 4);
  local_e8.type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&pTVar5->entries;
  local_e8.type._0_8_ =
       (_Rb_tree<duckdb::LogicalTypeId,std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>,std::_Select1st<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>>
        *)&local_120;
  TestVectorFlat::Generate((TestVectorInfo *)local_f0);
  TestVectorConstant::Generate((TestVectorInfo *)local_f0);
  TestVectorDictionary::Generate((TestVectorInfo *)local_f0);
  TestVectorSequence::Generate((TestVectorInfo *)local_f0);
  pTVar5 = unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
           ::operator->((unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
                         *)&local_148);
  _Var3._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       local_140._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
  puVar1 = (pTVar5->entries).
           super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (pTVar5->entries).
                super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (puVar8);
    DataChunk::Verify(pDVar6);
  }
  if (*(char *)&pFVar4[7]._vptr_FunctionData != '\0') {
    pTVar5 = unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
             ::operator->((unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
                           *)&local_148);
    puVar1 = (pTVar5->entries).
             super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (pTVar5->entries).
                  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
    {
      pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(puVar8);
      DataChunk::Flatten(pDVar6);
      pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(puVar8);
      DataChunk::Verify(pDVar6);
    }
  }
  _Var2._M_head_impl = local_148._M_head_impl;
  local_148._M_head_impl = (TestVectorTypesData *)0x0;
  *(TestVectorTypesData **)
   _Var3._M_t.
   super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
   .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
  ::~_Rb_tree(&local_120);
  ::std::vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>::~vector(&local_138);
  if (local_148._M_head_impl != (TestVectorTypesData *)0x0) {
    (*((local_148._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])
              ();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var3._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> TestVectorTypesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<TestVectorBindData>();

	auto result = make_uniq<TestVectorTypesData>();

	auto test_types = TestAllTypesFun::GetTestTypes();

	map<LogicalTypeId, TestType> test_type_map;
	for (auto &test_type : test_types) {
		test_type_map.insert(make_pair(test_type.type.id(), std::move(test_type)));
	}

	TestVectorInfo info(bind_data.types, test_type_map, result->entries);
	TestVectorFlat::Generate(info);
	TestVectorConstant::Generate(info);
	TestVectorDictionary::Generate(info);
	TestVectorSequence::Generate(info);
	for (auto &entry : result->entries) {
		entry->Verify();
	}
	if (bind_data.all_flat) {
		for (auto &entry : result->entries) {
			entry->Flatten();
			entry->Verify();
		}
	}
	return std::move(result);
}